

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

void __thiscall phaeton::Program::_delete(Program *this)

{
  ASTNodeList<const_phaeton::Decl,_(phaeton::ASTNode::ASTNodeKind)1,_phaeton::DeclList>::_delete
            (&this->Decls->
              super_ASTNodeList<const_phaeton::Decl,_(phaeton::ASTNode::ASTNodeKind)1,_phaeton::DeclList>
            );
  if (this->Decls != (DeclList *)0x0) {
    (*(this->Decls->
      super_ASTNodeList<const_phaeton::Decl,_(phaeton::ASTNode::ASTNodeKind)1,_phaeton::DeclList>).
      super_ASTNode._vptr_ASTNode[4])();
  }
  ASTNodeList<const_phaeton::Stmt,_(phaeton::ASTNode::ASTNodeKind)2,_phaeton::StmtList>::_delete
            (&this->Stmts->
              super_ASTNodeList<const_phaeton::Stmt,_(phaeton::ASTNode::ASTNodeKind)2,_phaeton::StmtList>
            );
  if (this->Stmts != (StmtList *)0x0) {
    (*(this->Stmts->
      super_ASTNodeList<const_phaeton::Stmt,_(phaeton::ASTNode::ASTNodeKind)2,_phaeton::StmtList>).
      super_ASTNode._vptr_ASTNode[4])();
  }
  if (this->Elem != (ElementDirective *)0x0) {
    ElementDirective::_delete(this->Elem);
    if (this->Elem != (ElementDirective *)0x0) {
      (*(this->Elem->super_ASTNode)._vptr_ASTNode[4])();
      return;
    }
  }
  return;
}

Assistant:

void Program::_delete() const {
  Decls->_delete();
  delete Decls;

  Stmts->_delete();
  delete Stmts;

  if (Elem) {
    Elem->_delete();
    delete Elem;
  }
}